

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O0

void __thiscall icu_63::Locale::~Locale(Locale *this)

{
  Locale *this_local;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Locale_004f5898;
  if (this->baseName != this->fullName) {
    uprv_free_63(this->baseName);
  }
  this->baseName = (char *)0x0;
  if (this->fullName != this->fullNameBuffer) {
    uprv_free_63(this->fullName);
    this->fullName = (char *)0x0;
  }
  UObject::~UObject(&this->super_UObject);
  return;
}

Assistant:

Locale::~Locale()
{
    if (baseName != fullName) {
        uprv_free(baseName);
    }
    baseName = NULL;
    /*if fullName is on the heap, we free it*/
    if (fullName != fullNameBuffer)
    {
        uprv_free(fullName);
        fullName = NULL;
    }
}